

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

QTextFormat formatDifference(QTextFormat *from,QTextFormat *to)

{
  QSharedDataPointer<QTextFormatPrivate> QVar1;
  char cVar2;
  _Rb_tree_node_base *p_Var3;
  QTextFormat *in_RDX;
  undefined8 extraout_RDX;
  _Rb_tree_node_base *p_Var4;
  long in_FS_OFFSET;
  QTextFormat QVar5;
  QMap<int,_QVariant> props;
  undefined1 local_60 [40];
  totally_ordered_wrapper<QTextFormatPrivate_*> local_38;
  
  local_38.ptr = *(QTextFormatPrivate **)(in_FS_OFFSET + 0x28);
  (from->d).d.ptr = (QTextFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&from->format_type = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::QTextFormat(from,in_RDX);
  local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::properties((QTextFormat *)local_60);
  if ((QTextFormatPrivate *)local_60._0_8_ == (QTextFormatPrivate *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var3 = *(_Rb_tree_node_base **)(local_60._0_8_ + 0x20);
  }
  p_Var4 = (_Rb_tree_node_base *)(local_60._0_8_ + 0x10);
  if ((QTextFormatPrivate *)local_60._0_8_ == (QTextFormatPrivate *)0x0) {
    p_Var4 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var3 != p_Var4) {
    do {
      QTextFormat::property((QVariant *)(local_60 + 8),to,p_Var3[1]._M_color);
      cVar2 = QVariant::equals((QVariant *)&p_Var3[1]._M_parent);
      QVariant::~QVariant((QVariant *)(local_60 + 8));
      if (cVar2 != '\0') {
        QTextFormat::clearProperty(from,p_Var3[1]._M_color);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != p_Var4);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              *)local_60);
  QVar1.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)
                ((totally_ordered_wrapper<QTextFormatPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr;
  if (QVar1.d.ptr == (totally_ordered_wrapper<QTextFormatPrivate_*>)local_38.ptr) {
    QVar5._8_8_ = extraout_RDX;
    QVar5.d.d.ptr = QVar1.d.ptr;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

static QTextFormat formatDifference(const QTextFormat &from, const QTextFormat &to)
{
    QTextFormat diff = to;

    const QMap<int, QVariant> props = to.properties();
    for (QMap<int, QVariant>::ConstIterator it = props.begin(), end = props.end();
         it != end; ++it)
        if (it.value() == from.property(it.key()))
            diff.clearProperty(it.key());

    return diff;
}